

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O0

IfcFloat Assimp::IFC::RecursiveSearch
                   (Curve *cv,IfcVector3 *val,IfcFloat a,IfcFloat b,uint samples,IfcFloat threshold,
                   uint recurse,uint max_recurse)

{
  uint uVar1;
  double dVar2;
  IfcFloat IVar3;
  undefined8 extraout_XMM0_Qa;
  double dVar4;
  IfcFloat local_128;
  IfcFloat t;
  aiVector3t<double> local_f8;
  double local_e0;
  IfcFloat wrapdiff;
  double local_d0;
  IfcFloat *local_c8;
  ParamRange *range;
  aiVector3t<double> local_a8;
  double local_90;
  IfcFloat diff;
  IfcFloat IStack_80;
  uint i;
  IfcFloat runner;
  IfcFloat min_diff [2];
  IfcFloat min_point [2];
  IfcFloat inf;
  IfcFloat delta;
  uint max_recurse_local;
  uint recurse_local;
  IfcFloat threshold_local;
  uint samples_local;
  IfcFloat b_local;
  IfcFloat a_local;
  IfcVector3 *val_local;
  Curve *cv_local;
  
  if (samples < 2) {
    __assert_fail("samples>1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/IFC/IFCCurve.cpp"
                  ,0x20e,
                  "IfcFloat Assimp::IFC::RecursiveSearch(const Curve *, const IfcVector3 &, IfcFloat, IfcFloat, unsigned int, IfcFloat, unsigned int, unsigned int)"
                 );
  }
  std::numeric_limits<double>::infinity();
  runner = INFINITY;
  min_diff[0] = INFINITY;
  IStack_80 = a;
  min_diff[1] = a;
  min_point[0] = b;
  for (diff._4_4_ = 0; diff._4_4_ < samples; diff._4_4_ = diff._4_4_ + 1) {
    (*cv->_vptr_Curve[3])(IStack_80,&range);
    ::operator-(&local_a8,(aiVector3t<double> *)&range,val);
    local_90 = aiVector3t<double>::SquareLength(&local_a8);
    if (runner <= local_90) {
      if (local_90 < min_diff[0]) {
        min_point[0] = IStack_80;
        min_diff[0] = local_90;
      }
    }
    else {
      min_diff[0] = runner;
      min_point[0] = min_diff[1];
      min_diff[1] = IStack_80;
      runner = local_90;
    }
    IStack_80 = (b - a) / (double)samples + IStack_80;
  }
  if ((runner == INFINITY) && (!NAN(runner))) {
    __assert_fail("min_diff[ 0 ] != inf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/IFC/IFCCurve.cpp"
                  ,0x223,
                  "IfcFloat Assimp::IFC::RecursiveSearch(const Curve *, const IfcVector3 &, IfcFloat, IfcFloat, unsigned int, IfcFloat, unsigned int, unsigned int)"
                 );
  }
  if ((min_diff[0] == INFINITY) && (!NAN(min_diff[0]))) {
    __assert_fail("min_diff[ 1 ] != inf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/IFC/IFCCurve.cpp"
                  ,0x224,
                  "IfcFloat Assimp::IFC::RecursiveSearch(const Curve *, const IfcVector3 &, IfcFloat, IfcFloat, unsigned int, IfcFloat, unsigned int, unsigned int)"
                 );
  }
  if ((ABS(a - min_diff[1]) < threshold) || (max_recurse <= recurse)) {
    cv_local = (Curve *)min_diff[1];
  }
  else {
    uVar1 = (*cv->_vptr_Curve[2])();
    if ((uVar1 & 1) != 0) {
      dVar2 = min_diff[1] - min_point[0];
      IVar3 = Curve::GetParametricRangeDelta(cv);
      dVar4 = IVar3 * 0.5;
      if (dVar4 < ABS(dVar2)) {
        (*cv->_vptr_Curve[5])();
        local_c8 = &wrapdiff;
        local_d0 = dVar4;
        (*cv->_vptr_Curve[3])(extraout_XMM0_Qa,&t);
        ::operator-(&local_f8,(aiVector3t<double> *)&t,val);
        local_e0 = aiVector3t<double>::SquareLength(&local_f8);
        IVar3 = min_diff[1];
        if (local_e0 < runner) {
          if (min_point[0] <= min_diff[1]) {
            local_128 = local_c8[1];
          }
          else {
            local_128 = *local_c8;
          }
          min_diff[1] = local_128;
          min_point[0] = IVar3;
        }
      }
    }
    cv_local = (Curve *)RecursiveSearch(cv,val,min_diff[1],min_point[0],samples,threshold,
                                        recurse + 1,max_recurse);
  }
  return (IfcFloat)cv_local;
}

Assistant:

IfcFloat RecursiveSearch(const Curve* cv, const IfcVector3& val, IfcFloat a, IfcFloat b,
        unsigned int samples, IfcFloat threshold, unsigned int recurse = 0, unsigned int max_recurse = 15) {
    ai_assert(samples>1);

    const IfcFloat delta = (b-a)/samples, inf = std::numeric_limits<IfcFloat>::infinity();
    IfcFloat min_point[2] = {a,b}, min_diff[2] = {inf,inf};
    IfcFloat runner = a;

    for (unsigned int i = 0; i < samples; ++i, runner += delta) {
        const IfcFloat diff = (cv->Eval(runner)-val).SquareLength();
        if (diff < min_diff[0]) {
            min_diff[1] = min_diff[0];
            min_point[1] = min_point[0];

            min_diff[0] = diff;
            min_point[0] = runner;
        }
        else if (diff < min_diff[1]) {
            min_diff[1] = diff;
            min_point[1] = runner;
        }
    }

    ai_assert( min_diff[ 0 ] != inf );
    ai_assert( min_diff[ 1 ] != inf );
    if ( std::fabs(a-min_point[0]) < threshold || recurse >= max_recurse) {
        return min_point[0];
    }

    // fix for closed curves to take their wrap-over into account
    if (cv->IsClosed() && std::fabs(min_point[0]-min_point[1]) > cv->GetParametricRangeDelta()*0.5  ) {
        const Curve::ParamRange& range = cv->GetParametricRange();
        const IfcFloat wrapdiff = (cv->Eval(range.first)-val).SquareLength();

        if (wrapdiff < min_diff[0]) {
            const IfcFloat t = min_point[0];
            min_point[0] = min_point[1] > min_point[0] ? range.first : range.second;
             min_point[1] = t;
        }
    }

    return RecursiveSearch(cv,val,min_point[0],min_point[1],samples,threshold,recurse+1,max_recurse);
}